

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O3

boolean decode_mcu_DC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_decoder *pjVar1;
  JBLOCKROW paJVar2;
  jpeg_error_mgr *pjVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  
  pjVar1 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    iVar10 = *(int *)((long)&pjVar1[4].start_pass + 4);
    if (iVar10 == 0) {
      process_restart(cinfo);
      iVar10 = *(int *)((long)&pjVar1[4].start_pass + 4);
    }
    *(int *)((long)&pjVar1[4].start_pass + 4) = iVar10 + -1;
  }
  if ((*(int *)&pjVar1[2].start_pass != -1) && (0 < cinfo->blocks_in_MCU)) {
    lVar7 = 0;
    do {
      paJVar2 = MCU_data[lVar7];
      lVar11 = (long)cinfo->MCU_membership[lVar7];
      iVar10 = cinfo->cur_comp_info[lVar11]->dc_tbl_no;
      p_Var8 = (&pjVar1[4].decode_mcu)[iVar10] +
               *(int *)((long)&pjVar1[3].start_pass + lVar11 * 4 + 4);
      iVar4 = arith_decode(cinfo,(uchar *)p_Var8);
      if (iVar4 == 0) {
        *(undefined4 *)((long)&pjVar1[3].start_pass + lVar11 * 4 + 4) = 0;
        iVar10 = *(int *)((long)&pjVar1[2].start_pass + lVar11 * 4 + 4);
      }
      else {
        uVar5 = arith_decode(cinfo,(uchar *)(p_Var8 + 1));
        p_Var8 = p_Var8 + (ulong)uVar5 + 2;
        iVar4 = arith_decode(cinfo,(uchar *)p_Var8);
        uVar12 = 0;
        if (iVar4 != 0) {
          p_Var8 = (&pjVar1[4].decode_mcu)[iVar10] + 0x14;
          iVar4 = arith_decode(cinfo,(uchar *)p_Var8);
          uVar12 = 1;
          while (iVar4 != 0) {
            uVar12 = uVar12 * 2;
            if (uVar12 == 0x8000) {
              pjVar3 = cinfo->err;
              pjVar3->msg_code = 0x75;
              (*pjVar3->emit_message)((j_common_ptr)cinfo,-1);
              *(undefined4 *)&pjVar1[2].start_pass = 0xffffffff;
              return 1;
            }
            p_Var8 = p_Var8 + 1;
            iVar4 = arith_decode(cinfo,(uchar *)p_Var8);
          }
        }
        iVar4 = 0;
        if ((int)((ulong)(1L << (cinfo->arith_dc_L[iVar10] & 0x3f)) >> 1) <= (int)uVar12) {
          if ((int)((ulong)(1L << (cinfo->arith_dc_U[iVar10] & 0x3f)) >> 1) < (int)uVar12) {
            iVar4 = uVar5 * 4 + 0xc;
          }
          else {
            iVar4 = uVar5 * 4 + 4;
          }
        }
        *(int *)((long)&pjVar1[3].start_pass + lVar11 * 4 + 4) = iVar4;
        uVar9 = uVar12;
        if (1 < uVar12) {
          do {
            uVar12 = (int)uVar12 >> 1;
            uVar6 = arith_decode(cinfo,(uchar *)(p_Var8 + 0xe));
            if (uVar6 != 0) {
              uVar6 = uVar12;
            }
            uVar9 = uVar9 | uVar6;
          } while (1 < uVar12);
        }
        uVar12 = ~uVar9;
        if (uVar5 == 0) {
          uVar12 = uVar9 + 1;
        }
        iVar10 = uVar12 + *(int *)((long)&pjVar1[2].start_pass + lVar11 * 4 + 4);
        *(int *)((long)&pjVar1[2].start_pass + lVar11 * 4 + 4) = iVar10;
      }
      (*paJVar2)[0] = (JCOEF)(iVar10 << ((byte)cinfo->Al & 0x1f));
      lVar7 = lVar7 + 1;
    } while (lVar7 < cinfo->blocks_in_MCU);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_first (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign;
  int v, m;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    tbl = cinfo->cur_comp_info[ci]->dc_tbl_no;

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2; st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	st = entropy->dc_stats[tbl] + 20;	/* Table F.4: X1 = 20 */
	while (arith_decode(cinfo, st)) {
	  if ((m <<= 1) == 0x8000) {
	    WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	    entropy->ct = -1;			/* magnitude overflow */
	    return TRUE;
	  }
	  st += 1;
	}
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;		   /* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
	entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      entropy->last_dc_val[ci] += v;
    }

    /* Scale and output the DC coefficient (assumes jpeg_natural_order[0]=0) */
    (*block)[0] = (JCOEF) (entropy->last_dc_val[ci] << cinfo->Al);
  }

  return TRUE;
}